

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Firework.cpp
# Opt level: O2

void __thiscall Firework::displayFireworkExplosion(Firework *this,Screen *screen)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double __x;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  undefined8 uStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  image;
  
  image.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_a8;
  image.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  image.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  iVar1 = this->endPosition[0];
  iVar2 = this->endPosition[1];
  uVar15 = (ulong)(uint)this->explosionDiameter;
  uStack_b0 = 0xfffffffffffffffe;
  iVar18 = this->explosionDiameter / -2;
  lVar7 = -(uVar15 * uVar15 + 0xf & 0xfffffffffffffff0);
  lVar20 = (long)&local_a8 + lVar7;
  uVar8 = this->explosionDiameter;
  uVar9 = 0;
  uVar10 = 0;
  lVar13 = lVar20;
  if (0 < (int)uVar8) {
    uVar10 = (ulong)uVar8;
  }
  for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
    for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      *(undefined1 *)(lVar13 + uVar12) = 0;
    }
    lVar13 = lVar13 + uVar15;
  }
  *(undefined8 *)((long)&uStack_b0 + lVar7) = 2;
  iVar11 = (int)*(undefined8 *)((long)&uStack_b0 + lVar7);
  __x = 0.0;
  while( true ) {
    uVar3 = this->explosionDiameter;
    if (6.28318530718 < __x) break;
    *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11d77b;
    dVar5 = cos(__x);
    iVar4 = this->explosionDiameter;
    *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11d7a7;
    dVar6 = sin(__x);
    *(undefined1 *)
     ((long)(int)(dVar5 * (double)((int)uVar3 / iVar11) + (double)((int)uVar8 / iVar11)) +
     (long)(int)(dVar6 * (double)(iVar4 / iVar11) + (double)((int)uVar8 / iVar11)) * uVar15 + lVar20
     ) = 1;
    __x = __x + 0.008726646259972222;
  }
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar3) {
    uVar10 = (ulong)uVar3;
  }
  bVar14 = 0;
  lVar13 = lVar20;
  for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
    for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
      bVar16 = *(byte *)(lVar13 + uVar12) ^ 1;
      if ((((bVar16 != 0) || (uVar9 == 0 || bVar14 != 0)) || (bVar17 = 1, uVar9 == uVar3 - 1)) &&
         ((bVar17 = bVar16 & bVar14, *(byte *)(lVar13 + uVar12) == 0 && (bVar14 == 1)))) {
        *(undefined1 *)(lVar13 + uVar12) = 1;
        bVar17 = bVar14;
      }
      bVar14 = bVar17;
    }
    lVar13 = lVar13 + uVar15;
  }
  uVar8 = this->explosionColor;
  *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11d86b;
  Screen::turnAttrOn(screen,(uVar8 & 0xff) << 8);
  if (1.5 < this->explosionFrameCounter || this->explosionFrameCounter == 1.5) {
    this->fireworkStage = 4;
  }
  else {
    iVar11 = this->explosionDiameter;
    for (lVar13 = 0; lVar13 < iVar11; lVar13 = lVar13 + 1) {
      for (lVar19 = 0; lVar19 < iVar11; lVar19 = lVar19 + 1) {
        if (*(char *)(lVar20 + lVar19) == '\x01') {
          *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11d8cf;
          uVar8 = rand();
          if ((uVar8 & 1) != 0) {
            *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11d8df;
            std::__cxx11::string::string((string *)&local_a8,(string *)&this->explosionParticle);
            *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11d8f5;
            Screen::printString(screen,&local_a8,iVar1 + iVar18 + (int)lVar13,
                                iVar2 + iVar18 + (int)lVar19);
            *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11d8fd;
            std::__cxx11::string::~string((string *)&local_a8);
          }
        }
        iVar11 = this->explosionDiameter;
      }
      lVar20 = lVar20 + uVar15;
    }
    this->explosionFrameCounter = this->explosionFrameCounter + 0.125;
  }
  uVar8 = this->explosionColor;
  *(undefined8 *)((long)&uStack_b0 + lVar7) = 0x11d953;
  Screen::turnAttrOff(screen,(uVar8 & 0xff) << 8);
  *(undefined8 *)
   ((long)&image.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].field_2 + 8) = 0x11d960;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_88);
  return;
}

Assistant:

void Firework::displayFireworkExplosion(Screen &screen) {
    double explosionCycleFrames = 3;      /* The number of frames to display the explosion circle                 */
    double explosionTotalTime = 1.5;         /* The total time, in seconds, to display the explosion circle          */

    std::vector<std::string> image;
    double i;
    int j, k;


    // Calculate the start coordinates for printing the 2d string array
    int startCursorPosition[2];
    startCursorPosition[0] = endPosition[0] - (explosionDiameter / 2);
    startCursorPosition[1] = endPosition[1] - (explosionDiameter / 2);

    // Generate the image boundaries
    bool boundaries[explosionDiameter][explosionDiameter];
    for (j = 0; j < explosionDiameter; j++){
        for(k = 0; k < explosionDiameter; k++){
            boundaries[j][k] = false;
        }
    }

    int x, y;
    const int cx = explosionDiameter / 2;
    const int cy = explosionDiameter / 2;
    for(i = 0; i <= (2 * PI); i+= (PI / 360) ){
        // Calculate a point on the edge of the circle
        x = (int)( cx + (explosionDiameter / 2) * cos(i) );
        y = (int)( cy + (explosionDiameter / 2) * sin(i) );

        // Store that point in the boundary array
        boundaries[y][x] = true;
    }

    // Fill in the boundary circle

    bool flag = false;
    for (j = 0; j < explosionDiameter; j++){
        for(k = 0; k < explosionDiameter; k++){
            if(boundaries[j][k] && !flag && j != 0 && j != (explosionDiameter - 1)){
                // Turn on the filling property
                flag = true;
            }
            else if(boundaries[j][k] && flag){
                // The other edge of the boundary circle has been reached
                flag = false;
            }
            else if(flag){
                boundaries[j][k] = true;
            }
        }
    }


    // Generate the image


    // Print the image
    screen.turnAttrOn(COLOR_PAIR(explosionColor));


    if(explosionFrameCounter < explosionTotalTime){
        for (j = 0; j < explosionDiameter; j++){
            for(k = 0; k < explosionDiameter; k++){
                if(boundaries[j][k]){
                    if(rand() % 2){
                        screen.printString(explosionParticle, startCursorPosition[0] + j, startCursorPosition[1] + k);
                    }
                }
            }
        }
        explosionFrameCounter += (explosionCycleFrames / FRAMES_PER_SECOND);
    }
    else{
        fireworkStage = FINISHED;
    }

    screen.turnAttrOff(COLOR_PAIR(explosionColor));
}